

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_d.cpp
# Opt level: O2

void drot(int n,double *x,int incx,double *y,int incy,double c,double s)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  ulong uVar4;
  double *pdVar5;
  bool bVar6;
  
  if (0 < n) {
    if (incy == 1 && incx == 1) {
      for (uVar4 = 0; (uint)n != uVar4; uVar4 = uVar4 + 1) {
        dVar1 = x[uVar4];
        dVar2 = y[uVar4];
        y[uVar4] = dVar2 * c - dVar1 * s;
        x[uVar4] = c * dVar1 + dVar2 * s;
      }
    }
    else {
      pdVar3 = y + (incy >> 0x1f & (1 - n) * incy);
      pdVar5 = x + (incx >> 0x1f & (1 - n) * incx);
      while (bVar6 = n != 0, n = n + -1, bVar6) {
        dVar1 = *pdVar5;
        dVar2 = *pdVar3;
        *pdVar3 = dVar2 * c - dVar1 * s;
        *pdVar5 = c * dVar1 + dVar2 * s;
        pdVar3 = pdVar3 + incy;
        pdVar5 = pdVar5 + incx;
      }
    }
  }
  return;
}

Assistant:

void drot ( int n, double x[], int incx, double y[], int incy, double c,
  double s )

//****************************************************************************80
//
//  Purpose:
//
//    DROT applies a plane rotation.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    02 May 2005
//
//  Author:
//
//    Original FORTRAN77 version by Charles Lawson, Richard Hanson, 
//    David Kincaid, Fred Krogh.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Jack Dongarra, Jim Bunch, Cleve Moler, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979,
//    ISBN13: 978-0-898711-72-1,
//    LC: QA214.L56.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for Fortran Usage,
//    Algorithm 539,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, September 1979, pages 308-323.
//
//  Parameters:
//
//    Input, int N, the number of entries in the vectors.
//
//    Input/output, double X[*], one of the vectors to be rotated.
//
//    Input, int INCX, the increment between successive entries of X.
//
//    Input/output, double Y[*], one of the vectors to be rotated.
//
//    Input, int INCY, the increment between successive elements of Y.
//
//    Input, double C, S, parameters (presumably the cosine and
//    sine of some angle) that define a plane rotation.
//
{
  int i;
  int ix;
  int iy;
  double stemp;

  if ( n <= 0 )
  {
  }
  else if ( incx == 1 && incy == 1 )
  {
    for ( i = 0; i < n; i++ )
    {
      stemp = c * x[i] + s * y[i];
      y[i]  = c * y[i] - s * x[i];
      x[i]  = stemp;
    }
  }
  else
  {
    if ( 0 <= incx )
    {
      ix = 0;
    }
    else
    {
      ix = ( - n + 1 ) * incx;
    }

    if ( 0 <= incy )
    {
      iy = 0;
    }
    else
    {
      iy = ( - n + 1 ) * incy;
    }

    for ( i = 0; i < n; i++ )
    {
      stemp = c * x[ix] + s * y[iy];
      y[iy] = c * y[iy] - s * x[ix];
      x[ix] = stemp;
      ix = ix + incx;
      iy = iy + incy;
    }

  }

  return;
}